

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqllogic_test_logger.cpp
# Opt level: O0

void __thiscall
duckdb::SQLLogicTestLogger::ExpectedErrorMismatch
          (SQLLogicTestLogger *this,string *expected_error,MaterializedQueryResult *result)

{
  SQLLogicTestLogger *in_RDI;
  string *in_stack_ffffffffffffff78;
  allocator *paVar1;
  allocator local_69;
  string local_68 [40];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  
  std::operator+(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  PrintErrorHeader(in_RDI,in_stack_ffffffffffffff78);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
  PrintLineSep();
  PrintSQL(this);
  paVar1 = &local_69;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,"Actual result:",paVar1);
  PrintHeader((string *)in_RDI);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  PrintLineSep();
  duckdb::QueryResult::Print();
  return;
}

Assistant:

void SQLLogicTestLogger::ExpectedErrorMismatch(const string &expected_error, MaterializedQueryResult &result) {
	PrintErrorHeader("Query failed, but error message did not match expected error message: " + expected_error);
	PrintLineSep();
	PrintSQL();
	PrintHeader("Actual result:");
	PrintLineSep();
	result.Print();
}